

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O0

MPP_RET h264e_pskip_ref_check(H264eDpb *dpb,H264eFrmInfo *frms)

{
  H264eDpbFrm *pHVar1;
  H264eDpbFrm *pHVar2;
  H264eDpbFrm *pHVar3;
  H264eDpbFrm *temp_frm_1;
  H264eDpbFrm *temp_frm;
  MPP_RET ret;
  RK_U32 i;
  H264eDpbFrm *refr;
  H264eDpbFrm *curr;
  H264eFrmInfo *frms_local;
  H264eDpb *dpb_local;
  
  pHVar1 = dpb->curr;
  pHVar2 = dpb->refr;
  if (((pHVar1->status).val >> 0x25 & 1) != 0) {
    for (temp_frm._4_4_ = 0; temp_frm._4_4_ < 0x10; temp_frm._4_4_ = temp_frm._4_4_ + 1) {
      pHVar3 = dpb->frames + temp_frm._4_4_;
      if (pHVar3->slot_idx == frms->refr_idx) {
        pHVar3->as_pskip_ref = 1;
      }
      else {
        pHVar3->as_pskip_ref = 0;
      }
    }
  }
  if ((((pHVar2->status).val >> 0x25 & 1) == 0) && (((pHVar1->status).val >> 0x25 & 1) == 0)) {
    for (temp_frm._4_4_ = 0; temp_frm._4_4_ < 0x10; temp_frm._4_4_ = temp_frm._4_4_ + 1) {
      if (dpb->frames + temp_frm._4_4_ != (H264eDpbFrm *)0x0) {
        dpb->frames[temp_frm._4_4_].as_pskip_ref = 0;
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_pskip_ref_check(H264eDpb *dpb, H264eFrmInfo *frms)
{
    H264eDpbFrm *curr = NULL;
    H264eDpbFrm *refr = NULL;
    RK_U32 i;
    MPP_RET ret = MPP_OK;

    curr = dpb->curr;
    refr = dpb->refr;

    if (curr->status.force_pskip_is_ref) {
        H264eDpbFrm *temp_frm;
        for (i = 0; i < H264E_MAX_REFS_CNT; i++) {
            temp_frm = &dpb->frames[i];
            if (temp_frm->slot_idx != frms->refr_idx) {
                temp_frm->as_pskip_ref = 0;
            } else {
                temp_frm->as_pskip_ref = 1;
            }
        }
    }

    if (!refr->status.force_pskip_is_ref && !curr->status.force_pskip_is_ref) {
        H264eDpbFrm *temp_frm;
        for (i = 0; i < H264E_MAX_REFS_CNT; i++) {
            temp_frm = &dpb->frames[i];
            if (temp_frm) {
                temp_frm->as_pskip_ref = 0;
            }
        }
    }

    return ret;
}